

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O2

bool __thiscall CoinStatsIndex::CustomAppend(CoinStatsIndex *this,BlockInfo *block)

{
  uint64_t *puVar1;
  uchar *puVar2;
  CScript *pCVar3;
  DataStream *this_00;
  int iVar4;
  uint256 *puVar5;
  CTransaction *this_01;
  pointer pCVar6;
  element_type *peVar7;
  pointer pCVar8;
  CDBWrapper *_parent;
  bool bVar9;
  CChainParams *consensusParams;
  CAmount CVar10;
  long lVar11;
  CBlockIndex *index;
  uint256 **ppuVar12;
  const_reference pvVar13;
  uint64_t uVar14;
  reference pvVar15;
  uint64_t *puVar16;
  size_type __n;
  CBlock *pCVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  CBlockUndo block_undo;
  uint256 out;
  uint256 expected_block_hash;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  Coin coin;
  DataStream local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = block->height;
  consensusParams = Params();
  CVar10 = GetBlockSubsidy(iVar4,&consensusParams->consensus);
  lVar11 = this->m_total_subsidy + CVar10;
  this->m_total_subsidy = lVar11;
  if (block->height < 1) {
    lVar19 = this->m_total_unspendable_amount + CVar10;
    this->m_total_unspendable_amount = lVar19;
    read_out.second.total_unspendables_genesis_block =
         CVar10 + this->m_total_unspendables_genesis_block;
    this->m_total_unspendables_genesis_block = read_out.second.total_unspendables_genesis_block;
LAB_006e4ece:
    read_out.second.total_prevout_spent_amount = this->m_total_prevout_spent_amount;
    read_out.second.total_new_outputs_ex_coinbase_amount =
         this->m_total_new_outputs_ex_coinbase_amount;
    read_out.second.total_coinbase_amount = this->m_total_coinbase_amount;
    lVar18 = (lVar11 + read_out.second.total_prevout_spent_amount) -
             (read_out.second.total_new_outputs_ex_coinbase_amount +
              read_out.second.total_coinbase_amount + lVar19);
    read_out.second.total_unspendable_amount = lVar19 + lVar18;
    this->m_total_unspendable_amount = read_out.second.total_unspendable_amount;
    read_out.second.total_unspendables_unclaimed_rewards =
         lVar18 + this->m_total_unspendables_unclaimed_rewards;
    this->m_total_unspendables_unclaimed_rewards =
         read_out.second.total_unspendables_unclaimed_rewards;
    puVar5 = block->hash;
    read_out.first.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    read_out.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    read_out.first.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    read_out.first.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    read_out.second.transaction_output_count = this->m_transaction_output_count;
    read_out.second.bogo_size = this->m_bogo_size;
    read_out.second.total_amount = this->m_total_amount;
    read_out.second.total_unspendables_bip30 = this->m_total_unspendables_bip30;
    read_out.second.total_unspendables_scripts = this->m_total_unspendables_scripts;
    out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    read_out.second.total_subsidy = lVar11;
    MuHash3072::Finalize(&this->m_muhash,&out);
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x10] =
         out.super_base_blob<256U>.m_data._M_elems[0x10];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x11] =
         out.super_base_blob<256U>.m_data._M_elems[0x11];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x12] =
         out.super_base_blob<256U>.m_data._M_elems[0x12];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x13] =
         out.super_base_blob<256U>.m_data._M_elems[0x13];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x14] =
         out.super_base_blob<256U>.m_data._M_elems[0x14];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x15] =
         out.super_base_blob<256U>.m_data._M_elems[0x15];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x16] =
         out.super_base_blob<256U>.m_data._M_elems[0x16];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x17] =
         out.super_base_blob<256U>.m_data._M_elems[0x17];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x18] =
         out.super_base_blob<256U>.m_data._M_elems[0x18];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x19] =
         out.super_base_blob<256U>.m_data._M_elems[0x19];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         out.super_base_blob<256U>.m_data._M_elems[0x1a];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         out.super_base_blob<256U>.m_data._M_elems[0x1b];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         out.super_base_blob<256U>.m_data._M_elems[0x1c];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         out.super_base_blob<256U>.m_data._M_elems[0x1d];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         out.super_base_blob<256U>.m_data._M_elems[0x1e];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         out.super_base_blob<256U>.m_data._M_elems[0x1f];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0] =
         out.super_base_blob<256U>.m_data._M_elems[0];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[1] =
         out.super_base_blob<256U>.m_data._M_elems[1];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[2] =
         out.super_base_blob<256U>.m_data._M_elems[2];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[3] =
         out.super_base_blob<256U>.m_data._M_elems[3];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[4] =
         out.super_base_blob<256U>.m_data._M_elems[4];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[5] =
         out.super_base_blob<256U>.m_data._M_elems[5];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[6] =
         out.super_base_blob<256U>.m_data._M_elems[6];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[7] =
         out.super_base_blob<256U>.m_data._M_elems[7];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[8] =
         out.super_base_blob<256U>.m_data._M_elems[8];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[9] =
         out.super_base_blob<256U>.m_data._M_elems[9];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[10] =
         out.super_base_blob<256U>.m_data._M_elems[10];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xb] =
         out.super_base_blob<256U>.m_data._M_elems[0xb];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xc] =
         out.super_base_blob<256U>.m_data._M_elems[0xc];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xd] =
         out.super_base_blob<256U>.m_data._M_elems[0xd];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xe] =
         out.super_base_blob<256U>.m_data._M_elems[0xe];
    read_out.second.muhash.super_base_blob<256U>.m_data._M_elems[0xf] =
         out.super_base_blob<256U>.m_data._M_elems[0xf];
    _parent = &((this->m_db)._M_t.
                super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper;
    expected_block_hash.super_base_blob<256U>.m_data._M_elems._0_4_ = block->height;
    CDBBatch::CDBBatch((CDBBatch *)&coin,_parent);
    this_00 = (DataStream *)((long)&coin.out.scriptPubKey.super_CScriptBase._union + 8);
    DataStream::reserve(this_00,0x40);
    DataStream::reserve(&local_68,0x400);
    DataStream::operator<<(this_00,(DBHeightKey *)&expected_block_hash);
    base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)&read_out,&local_68);
    Serialize<DataStream,_(anonymous_namespace)::DBVal>(&local_68,&read_out.second);
    key.m_data = (byte *)(coin.out.scriptPubKey.super_CScriptBase._union._8_8_ + coin._40_8_);
    key.m_size = coin.out.scriptPubKey.super_CScriptBase._union._16_8_ - (long)key.m_data;
    CDBBatch::WriteImpl((CDBBatch *)&coin,key,&local_68);
    if (coin.out.scriptPubKey.super_CScriptBase._union._16_8_ !=
        coin.out.scriptPubKey.super_CScriptBase._union._8_8_) {
      coin.out.scriptPubKey.super_CScriptBase._union._16_8_ =
           coin.out.scriptPubKey.super_CScriptBase._union._8_8_;
    }
    coin._40_8_ = 0;
    if (local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    local_68.m_read_pos = 0;
    bVar9 = CDBWrapper::WriteBatch(_parent,(CDBBatch *)&coin,false);
    CDBBatch::~CDBBatch((CDBBatch *)&coin);
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&read_out,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
               ,0x7d,false);
    index = ::node::BlockManager::LookupBlockIndex
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,block->hash);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&read_out);
    bVar9 = ::node::BlockManager::UndoReadFromDisk
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,&block_undo,index);
    if (bVar9) {
      memset(&read_out,0,0xa0);
      coin.out.nValue = CONCAT44(coin.out.nValue._4_4_,block->height + -1);
      bVar9 = CDBWrapper::
              Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                        (&((this->m_db)._M_t.
                           super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                           .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                          super_CDBWrapper,(DBHeightKey *)&coin,&read_out);
      if (bVar9) {
        ppuVar12 = inline_assertion_check<true,uint256_const*const&>
                             (&block->prev_hash,
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
                              ,0x87,"CustomAppend","block.prev_hash");
        puVar5 = *ppuVar12;
        expected_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
        expected_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
        expected_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
        expected_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
        bVar9 = ::operator!=((base_blob<256U> *)&read_out,&expected_block_hash.super_base_blob<256U>
                            );
        if (bVar9) {
          base_blob<256u>::ToString_abi_cxx11_((string *)&coin,(base_blob<256u> *)&read_out);
          fmt = (char *)0x6e4b7d;
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&out,(base_blob<256u> *)&expected_block_hash);
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
          ;
          source_file._M_len = 0x61;
          logging_function._M_str = "CustomAppend";
          logging_function._M_len = 0xc;
          LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,0x8a,(LogFlags)&coin,(Level)(string *)&out,fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)block,
                     in_stack_fffffffffffffe20);
          std::__cxx11::string::~string((string *)&out);
          std::__cxx11::string::~string((string *)&coin);
          coin.out.scriptPubKey.super_CScriptBase._union._8_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
          coin.out.scriptPubKey.super_CScriptBase._union._9_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
          coin.out.scriptPubKey.super_CScriptBase._union._10_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
          coin.out.scriptPubKey.super_CScriptBase._union._11_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
          coin.out.scriptPubKey.super_CScriptBase._union._12_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
          coin.out.scriptPubKey.super_CScriptBase._union._13_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
          coin.out.scriptPubKey.super_CScriptBase._union._14_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
          coin.out.scriptPubKey.super_CScriptBase._union._15_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
          coin.out.scriptPubKey.super_CScriptBase._union._16_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
          coin.out.scriptPubKey.super_CScriptBase._union._17_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
          coin.out.scriptPubKey.super_CScriptBase._union._18_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
          coin.out.scriptPubKey.super_CScriptBase._union._19_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
          coin.out.scriptPubKey.super_CScriptBase._union._20_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
          coin.out.scriptPubKey.super_CScriptBase._union._21_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
          coin.out.scriptPubKey.super_CScriptBase._union._22_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
          coin.out.scriptPubKey.super_CScriptBase._union._23_1_ =
               expected_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
          coin.out.nValue._0_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[0];
          coin.out.nValue._1_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[1];
          coin.out.nValue._2_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[2];
          coin.out.nValue._3_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[3];
          coin.out.nValue._4_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[4];
          coin.out.nValue._5_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[5];
          coin.out.nValue._6_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[6];
          coin.out.nValue._7_1_ = expected_block_hash.super_base_blob<256U>.m_data._M_elems[7];
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)expected_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          bVar9 = CDBWrapper::
                  Read<(anonymous_namespace)::DBHashKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                            (&((this->m_db)._M_t.
                               super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                               .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                              super_CDBWrapper,(DBHashKey *)&coin,&read_out);
          if (!bVar9) {
            base_blob<256u>::ToString_abi_cxx11_
                      ((string *)&coin,(base_blob<256u> *)&expected_block_hash);
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
            ;
            source_file_00._M_len = 0x61;
            logging_function_00._M_str = "CustomAppend";
            logging_function_00._M_len = 0xc;
            LogPrintf_<char[13],std::__cxx11::string>
                      (logging_function_00,source_file_00,0x8e,
                       IPC|I2P|QT|LIBEVENT|PRUNE|CMPCTBLOCK|ADDRMAN|RPC|ZMQ|TOR,0xca5014,
                       (char *)&coin,(char (*) [13])block,in_stack_fffffffffffffe20);
            std::__cxx11::string::~string((string *)&coin);
            goto LAB_006e510f;
          }
        }
        pCVar17 = block->data;
        if (pCVar17 == (CBlock *)0x0) {
          __assert_fail("block.data",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
                        ,0x94,
                        "virtual bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo &)");
        }
        puVar1 = &this->m_bogo_size;
        for (__n = 0; __n < (ulong)((long)(pCVar17->vtx).
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pCVar17->vtx).
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
            __n = __n + 1) {
          pvVar13 = std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::at(&pCVar17->vtx,__n);
          bVar9 = IsBIP30Unspendable(index);
          if (bVar9) {
            bVar9 = CTransaction::IsCoinBase
                              ((pvVar13->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
            if (!bVar9) goto LAB_006e4c9e;
            this->m_total_unspendable_amount = this->m_total_unspendable_amount + CVar10;
            this->m_total_unspendables_bip30 = this->m_total_unspendables_bip30 + CVar10;
          }
          else {
LAB_006e4c9e:
            uVar20 = 0;
            while( true ) {
              this_01 = (pvVar13->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              pCVar6 = (this_01->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)(((long)(this_01->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6) / 0x28)
                  <= (ulong)uVar20) break;
              iVar4 = block->height;
              bVar9 = CTransaction::IsCoinBase(this_01);
              Coin::Coin(&coin,pCVar6 + uVar20,iVar4,bVar9);
              peVar7 = (pvVar13->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              out.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              out.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              out.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
              out.super_base_blob<256U>.m_data._M_elems._24_8_ =
                   *(undefined8 *)
                    ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
              pCVar3 = &coin.out.scriptPubKey;
              bVar9 = CScript::IsUnspendable(pCVar3);
              if (bVar9) {
                this->m_total_unspendable_amount =
                     this->m_total_unspendable_amount + coin.out.nValue;
                uVar14 = coin.out.nValue;
                puVar16 = (uint64_t *)&this->m_total_unspendables_scripts;
              }
              else {
                kernel::ApplyCoinHash(&this->m_muhash,(COutPoint *)&out,&coin);
                bVar9 = CTransaction::IsCoinBase
                                  ((pvVar13->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
                (&this->m_total_new_outputs_ex_coinbase_amount)[bVar9] =
                     (&this->m_total_new_outputs_ex_coinbase_amount)[bVar9] + coin.out.nValue;
                this->m_transaction_output_count = this->m_transaction_output_count + 1;
                this->m_total_amount = this->m_total_amount + coin.out.nValue;
                uVar14 = kernel::GetBogoSize(pCVar3);
                puVar16 = puVar1;
              }
              *puVar16 = *puVar16 + uVar14;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        (&pCVar3->super_CScriptBase);
              uVar20 = uVar20 + 1;
            }
            bVar9 = CTransaction::IsCoinBase(this_01);
            if (!bVar9) {
              pvVar15 = std::vector<CTxUndo,_std::allocator<CTxUndo>_>::at
                                  (&block_undo.vtxundo,__n - 1);
              lVar19 = 0;
              lVar11 = 0x20;
              uVar21 = 0;
              while( true ) {
                pCVar8 = (pvVar15->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl
                         .super__Vector_impl_data._M_start;
                if ((ulong)(((long)(pvVar15->vprevout).
                                   super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pCVar8) / 0x30) <=
                    uVar21) break;
                Coin::Coin(&coin,(Coin *)((long)&(pCVar8->out).nValue + lVar19));
                lVar18 = (long)(((pvVar13->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                puVar2 = (uchar *)(lVar18 + -0x20 + lVar11);
                out.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)puVar2;
                out.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 8);
                puVar2 = (uchar *)(lVar18 + -0x10 + lVar11);
                out.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar2;
                out.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 8);
                pCVar3 = &coin.out.scriptPubKey;
                kernel::RemoveCoinHash(&this->m_muhash,(COutPoint *)&out,&coin);
                this->m_total_prevout_spent_amount =
                     this->m_total_prevout_spent_amount + coin.out.nValue;
                this->m_transaction_output_count = this->m_transaction_output_count - 1;
                this->m_total_amount = this->m_total_amount - coin.out.nValue;
                uVar14 = kernel::GetBogoSize(pCVar3);
                *puVar1 = *puVar1 - uVar14;
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          (&pCVar3->super_CScriptBase);
                uVar21 = uVar21 + 1;
                lVar11 = lVar11 + 0x68;
                lVar19 = lVar19 + 0x30;
              }
            }
          }
          pCVar17 = block->data;
        }
        lVar11 = this->m_total_subsidy;
        lVar19 = this->m_total_unspendable_amount;
        read_out.second.total_unspendables_genesis_block = this->m_total_unspendables_genesis_block;
        goto LAB_006e4ece;
      }
    }
LAB_006e510f:
    bVar9 = false;
  }
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    CBlockUndo block_undo;
    const CAmount block_subsidy{GetBlockSubsidy(block.height, Params().GetConsensus())};
    m_total_subsidy += block_subsidy;

    // Ignore genesis block
    if (block.height > 0) {
        // pindex variable gives indexing code access to node internals. It
        // will be removed in upcoming commit
        const CBlockIndex* pindex = WITH_LOCK(cs_main, return m_chainstate->m_blockman.LookupBlockIndex(block.hash));
        if (!m_chainstate->m_blockman.UndoReadFromDisk(block_undo, *pindex)) {
            return false;
        }

        std::pair<uint256, DBVal> read_out;
        if (!m_db->Read(DBHeightKey(block.height - 1), read_out)) {
            return false;
        }

        uint256 expected_block_hash{*Assert(block.prev_hash)};
        if (read_out.first != expected_block_hash) {
            LogPrintf("WARNING: previous block header belongs to unexpected block %s; expected %s\n",
                      read_out.first.ToString(), expected_block_hash.ToString());

            if (!m_db->Read(DBHashKey(expected_block_hash), read_out)) {
                LogError("%s: previous block header not found; expected %s\n",
                             __func__, expected_block_hash.ToString());
                return false;
            }
        }

        // Add the new utxos created from the block
        assert(block.data);
        for (size_t i = 0; i < block.data->vtx.size(); ++i) {
            const auto& tx{block.data->vtx.at(i)};

            // Skip duplicate txid coinbase transactions (BIP30).
            if (IsBIP30Unspendable(*pindex) && tx->IsCoinBase()) {
                m_total_unspendable_amount += block_subsidy;
                m_total_unspendables_bip30 += block_subsidy;
                continue;
            }

            for (uint32_t j = 0; j < tx->vout.size(); ++j) {
                const CTxOut& out{tx->vout[j]};
                Coin coin{out, block.height, tx->IsCoinBase()};
                COutPoint outpoint{tx->GetHash(), j};

                // Skip unspendable coins
                if (coin.out.scriptPubKey.IsUnspendable()) {
                    m_total_unspendable_amount += coin.out.nValue;
                    m_total_unspendables_scripts += coin.out.nValue;
                    continue;
                }

                ApplyCoinHash(m_muhash, outpoint, coin);

                if (tx->IsCoinBase()) {
                    m_total_coinbase_amount += coin.out.nValue;
                } else {
                    m_total_new_outputs_ex_coinbase_amount += coin.out.nValue;
                }

                ++m_transaction_output_count;
                m_total_amount += coin.out.nValue;
                m_bogo_size += GetBogoSize(coin.out.scriptPubKey);
            }

            // The coinbase tx has no undo data since no former output is spent
            if (!tx->IsCoinBase()) {
                const auto& tx_undo{block_undo.vtxundo.at(i - 1)};

                for (size_t j = 0; j < tx_undo.vprevout.size(); ++j) {
                    Coin coin{tx_undo.vprevout[j]};
                    COutPoint outpoint{tx->vin[j].prevout.hash, tx->vin[j].prevout.n};

                    RemoveCoinHash(m_muhash, outpoint, coin);

                    m_total_prevout_spent_amount += coin.out.nValue;

                    --m_transaction_output_count;
                    m_total_amount -= coin.out.nValue;
                    m_bogo_size -= GetBogoSize(coin.out.scriptPubKey);
                }
            }
        }
    } else {
        // genesis block
        m_total_unspendable_amount += block_subsidy;
        m_total_unspendables_genesis_block += block_subsidy;
    }

    // If spent prevouts + block subsidy are still a higher amount than
    // new outputs + coinbase + current unspendable amount this means
    // the miner did not claim the full block reward. Unclaimed block
    // rewards are also unspendable.
    const CAmount unclaimed_rewards{(m_total_prevout_spent_amount + m_total_subsidy) - (m_total_new_outputs_ex_coinbase_amount + m_total_coinbase_amount + m_total_unspendable_amount)};
    m_total_unspendable_amount += unclaimed_rewards;
    m_total_unspendables_unclaimed_rewards += unclaimed_rewards;

    std::pair<uint256, DBVal> value;
    value.first = block.hash;
    value.second.transaction_output_count = m_transaction_output_count;
    value.second.bogo_size = m_bogo_size;
    value.second.total_amount = m_total_amount;
    value.second.total_subsidy = m_total_subsidy;
    value.second.total_unspendable_amount = m_total_unspendable_amount;
    value.second.total_prevout_spent_amount = m_total_prevout_spent_amount;
    value.second.total_new_outputs_ex_coinbase_amount = m_total_new_outputs_ex_coinbase_amount;
    value.second.total_coinbase_amount = m_total_coinbase_amount;
    value.second.total_unspendables_genesis_block = m_total_unspendables_genesis_block;
    value.second.total_unspendables_bip30 = m_total_unspendables_bip30;
    value.second.total_unspendables_scripts = m_total_unspendables_scripts;
    value.second.total_unspendables_unclaimed_rewards = m_total_unspendables_unclaimed_rewards;

    uint256 out;
    m_muhash.Finalize(out);
    value.second.muhash = out;

    // Intentionally do not update DB_MUHASH here so it stays in sync with
    // DB_BEST_BLOCK, and the index is not corrupted if there is an unclean shutdown.
    return m_db->Write(DBHeightKey(block.height), value);
}